

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

token * dmrC_preprocess(dmr_C *C,token *token)

{
  token *ptVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  symbol *psVar5;
  position entry;
  char *pos;
  long lVar6;
  position C_00;
  stream *stream;
  token *local_40;
  token *token_local;
  
  C->preprocessing = 1;
  pos = "preprocessor";
  local_40 = token;
  uVar3 = dmrC_init_stream(C,"preprocessor",-1,C->includepath);
  for (lVar6 = 8; lVar6 != 0x128; lVar6 = lVar6 + 0x10) {
    ptVar1 = *(token **)((long)&init_preprocessor_normal + lVar6);
    pos._4_4_ = 0;
    pos._0_4_ = uVar3;
    psVar5 = dmrC_create_symbol(C->S,uVar3,*(char **)(&UNK_001451f8 + lVar6),1,0x40);
    (psVar5->field_14).field_0.expansion = ptVar1;
    (psVar5->field_14).field_1.normal = 1;
  }
  for (lVar6 = 8; lVar6 != 0x68; lVar6 = lVar6 + 0x10) {
    ptVar1 = *(token **)((long)&init_preprocessor_special + lVar6);
    pos._4_4_ = 0;
    pos._0_4_ = uVar3;
    psVar5 = dmrC_create_symbol(C->S,uVar3,
                                *(char **)((long)&PTR_handle_argv_include_00145318 + lVar6),1,0x40);
    (psVar5->field_14).field_0.expansion = ptVar1;
    (psVar5->field_14).field_1.normal = 0;
  }
  C->counter_macro = 0;
  token_local = (token *)&C->token_allocator;
  C_00 = (position)&local_40;
LAB_0011bf4f:
  do {
    while( true ) {
      entry = (position)scan_next((dmr_C *)C_00,(token **)pos);
      if (entry == (position)&dmrC_eof_token_entry_) {
        C->preprocessing = 0;
        return local_40;
      }
      uVar2 = *(ulong *)entry;
      stream = C->T->input_streams + ((uint)(uVar2 >> 6) & 0x3fff);
      if (((((uint)uVar2 & 0x10003f) != 0x100011) || ((long)uVar2 < 0)) ||
         (*(int *)((long)entry + 0x10) != 0x23)) break;
      preprocessor_line(C,stream,(token **)C_00);
LAB_0011c03a:
      dmrC_allocator_free((allocator *)token_local,(void *)entry);
      pos = (char *)entry;
    }
    uVar3 = (uint)uVar2 & 0x3f;
    if (uVar3 != 0x12) {
      if (uVar3 == 0x13) {
        if (stream->top_if != (token *)0x0) {
          stream->dirty = 1;
          stream->protect = (ident *)0x0;
          stream->ifndef = (token *)0x0;
          pos = *(char **)&stream->top_if->pos;
          dmrC_sparse_error(C,(position)pos,"unterminated preprocessor conditional");
          stream->top_if = (token *)0x0;
          C->false_nesting = 0;
        }
        if (stream->dirty == 0) {
          stream->constant = CONSTANT_FILE_YES;
        }
        goto LAB_0011c001;
      }
      if ((stream->dirty == 0) && (stream->dirty = 1, stream->ifndef == (token *)0x0)) {
        stream->protect = (ident *)0x0;
      }
      if (C->false_nesting != 0) {
        *(undefined8 *)C_00 = *(undefined8 *)((long)entry + 8);
        goto LAB_0011c03a;
      }
      if ((*(uint *)entry & 0x3f) == 2) break;
      goto LAB_0011c06a;
    }
LAB_0011c001:
    *(undefined8 *)C_00 = *(undefined8 *)((long)entry + 8);
  } while( true );
  pos = (char *)C_00;
  iVar4 = expand_one_symbol(C,(token **)C_00);
  if (iVar4 != 0) {
LAB_0011c06a:
    C_00 = (position)((long)entry + 8);
  }
  goto LAB_0011bf4f;
}

Assistant:

struct token * dmrC_preprocess(struct dmr_C *C, struct token *token)
{
	C->preprocessing = 1;
	init_preprocessor(C);
	do_preprocess(C, &token);

	// Drop all expressions from preprocessing, they're not used any more.
	// This is not true when we have multiple files, though ;/
	// clear_expression_alloc();
	C->preprocessing = 0;

	return token;
}